

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O3

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::CreateBacking
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint index)

{
  uint **obj;
  JitArenaAllocator *this_00;
  long lVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  uint **ppuVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar17 [16];
  
  uVar12 = this->maxIndex;
  if ((index < uVar12) && (this->backingStore[index >> 4] != (uint *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
                       ,0xc4,"(index >= maxIndex || backingStore[index / numPerSegment] == nullptr)"
                       ,"index >= maxIndex || backingStore[index / numPerSegment] == nullptr");
    if (!bVar4) goto LAB_003f0b13;
    *puVar6 = 0;
    uVar12 = this->maxIndex;
  }
  uVar10 = index + 1 & 0xf;
  uVar3 = (index - uVar10) + 0x11;
  if (uVar10 == 0) {
    uVar3 = index + 1;
  }
  uVar10 = uVar3 >> 4;
  uVar13 = uVar12 >> 4;
  if (uVar13 < uVar10) {
    ppuVar7 = (uint **)new__<Memory::JitArenaAllocator>((ulong)(uVar10 * 8),this->alloc,0x3eba5c);
    if (0xf < uVar12) {
      uVar8 = 0;
      do {
        ppuVar7[uVar8] = this->backingStore[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar13 != uVar8);
    }
    memset(ppuVar7 + uVar13,0,(ulong)(uVar10 + ~uVar13) * 8 + 8);
    this->maxIndex = uVar3;
    obj = this->backingStore;
    this->backingStore = ppuVar7;
    Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int*>(this->alloc,(ulong)uVar13,obj);
  }
  if (this->backingStore[index >> 4] == (uint *)0x0) {
    this_00 = this->alloc;
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_003f0b13;
      *puVar6 = 0;
    }
    pcVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,0x40);
    if (pcVar9 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_01;
      in_XMM1._0_8_ = extraout_XMM1_Qa_01;
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_003f0b13:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    uVar8 = (ulong)((index >> 4) << 3);
    *(char **)((long)this->backingStore + uVar8) = pcVar9;
    lVar1 = *(long *)((long)this->backingStore + uVar8);
    auVar14._0_8_ = CONCAT44(index,index) & 0xfffffff0fffffff0;
    auVar14._8_4_ = index & 0xfffffff0;
    auVar14._12_4_ = index & 0xfffffff0;
    auVar15 = pmovsxbd(in_XMM1,0x3020100);
    lVar11 = 0;
    auVar17 = pmovsxbd(in_XMM2,0x4040404);
    do {
      *(undefined1 (*) [16])(lVar1 + lVar11 * 4) = auVar14 | auVar15;
      lVar11 = lVar11 + 4;
      auVar16._0_4_ = auVar15._0_4_ + auVar17._0_4_;
      auVar16._4_4_ = auVar15._4_4_ + auVar17._4_4_;
      auVar16._8_4_ = auVar15._8_4_ + auVar17._8_4_;
      auVar16._12_4_ = auVar15._12_4_ + auVar17._12_4_;
      auVar15 = auVar16;
    } while (lVar11 != 0x10);
  }
  return;
}

Assistant:

inline void CreateBacking(indexType index)
    {
        Assert(index >= maxIndex || backingStore[index / numPerSegment] == nullptr);
        // grow the size of the pointer array if needed
        EnsureBaseSize(index);
        if (backingStore[index / numPerSegment] == nullptr)
        {
            // allocate a new segment
            backingStore[index / numPerSegment] = AllocatorNewArrayLeaf(TAllocator, alloc, indexType, numPerSegment);
            indexType baseForSegment = (index / numPerSegment) * numPerSegment;
            for (indexType i = 0; i < numPerSegment; i++)
            {
                backingStore[index / numPerSegment][i] = i + baseForSegment;
            }
        }
    }